

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testDeepScanLineBasic.cpp
# Opt level: O3

void anon_unknown.dwarf_10c881::generateRandomFile
               (string *filename,int channelCount,Compression compression,bool bulkWrite,
               Box2i *dataWindow,Box2i *displayWindow)

{
  long lVar1;
  bool bVar2;
  PixelType PVar3;
  char cVar4;
  ushort uVar5;
  Array2D<void_*> *pAVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  ostream *poVar11;
  string *psVar12;
  void *pvVar13;
  void *pvVar14;
  int *piVar15;
  ushort uVar16;
  int iVar17;
  int iVar18;
  uint uVar19;
  ulong uVar20;
  uint uVar21;
  PixelType PVar22;
  ulong size;
  long lVar23;
  ulong uVar24;
  ulong uVar25;
  ulong uVar26;
  int iVar27;
  uint uVar28;
  uint uVar30;
  float fVar32;
  long local_2f8;
  Array<Imf_3_2::Array2D<void_*>_> data;
  int type;
  undefined4 uStack_284;
  long local_278 [2];
  DeepScanLineOutputFile file;
  DeepFrameBuffer frameBuffer;
  stringstream ss;
  undefined1 local_1e0 [112];
  ios_base local_170 [264];
  Channel local_68 [56];
  ulong uVar29;
  ulong uVar31;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"generating ",0xb);
  std::ostream::flush();
  frameBuffer._map._M_t._M_impl._0_8_ = 0;
  Imf_3_2::Header::Header
            ((Header *)&ss,(Box *)displayWindow,(Box *)dataWindow,1.0,(Vec2 *)&frameBuffer,1.0,
             INCREASING_Y,compression);
  Imf_3_2::Header::operator=((Header *)(anonymous_namespace)::header,(Header *)&ss);
  Imf_3_2::Header::~Header((Header *)&ss);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"compression ",0xc);
  poVar11 = (ostream *)std::ostream::operator<<(&std::cout,compression);
  std::__ostream_insert<char,std::char_traits<char>>(poVar11," ",1);
  std::ostream::flush();
  iVar8 = (dataWindow->min).y;
  iVar7 = (dataWindow->max).x - (dataWindow->min).x;
  iVar17 = (dataWindow->max).y;
  if (DAT_001f02f8._M_current != (anonymous_namespace)::channelTypes) {
    DAT_001f02f8._M_current = (anonymous_namespace)::channelTypes;
  }
  if (0 < channelCount) {
    iVar27 = 0;
    do {
      type = random_int(3);
      std::__cxx11::stringstream::stringstream((stringstream *)&ss);
      std::ostream::operator<<(local_1e0,iVar27);
      std::__cxx11::stringbuf::str();
      if (type == 0) {
        psVar12 = (string *)Imf_3_2::Header::channels();
        Imf_3_2::Channel::Channel(local_68,UINT,1,1,false);
        Imf_3_2::ChannelList::insert(psVar12,(Channel *)&frameBuffer);
      }
      if (type == 1) {
        psVar12 = (string *)Imf_3_2::Header::channels();
        Imf_3_2::Channel::Channel(local_68,HALF,1,1,false);
        Imf_3_2::ChannelList::insert(psVar12,(Channel *)&frameBuffer);
      }
      if (type == 2) {
        psVar12 = (string *)Imf_3_2::Header::channels();
        Imf_3_2::Channel::Channel(local_68,FLOAT,1,1,false);
        Imf_3_2::ChannelList::insert(psVar12,(Channel *)&frameBuffer);
      }
      if (DAT_001f02f8._M_current == DAT_001f0300) {
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                  ((vector<int,std::allocator<int>> *)&(anonymous_namespace)::channelTypes,
                   DAT_001f02f8,&type);
      }
      else {
        *DAT_001f02f8._M_current = type;
        DAT_001f02f8._M_current = DAT_001f02f8._M_current + 1;
      }
      if ((_Base_ptr *)frameBuffer._map._M_t._M_impl._0_8_ !=
          &frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
        operator_delete((void *)frameBuffer._map._M_t._M_impl._0_8_,
                        (ulong)((long)&(frameBuffer._map._M_t._M_impl.super__Rb_tree_header.
                                        _M_header._M_parent)->_M_color + 1));
      }
      std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
      std::ios_base::~ios_base(local_170);
      iVar27 = iVar27 + 1;
    } while (channelCount != iVar27);
  }
  iVar17 = iVar17 - iVar8;
  uVar30 = iVar7 + 1;
  uVar31 = (ulong)uVar30;
  uVar28 = iVar17 + 1;
  uVar29 = (ulong)uVar28;
  Imf_3_2::Header::setType((string *)(anonymous_namespace)::header);
  size = (ulong)(uint)channelCount;
  Imf_3_2::Array<Imf_3_2::Array2D<void_*>_>::Array(&data,size);
  if (channelCount < 1) {
    uVar20 = (long)(int)uVar28 * (long)(int)uVar30;
  }
  else {
    uVar20 = (long)(int)uVar28 * (long)(int)uVar30;
    lVar23 = 0;
    do {
      pAVar6 = data._data;
      pvVar13 = operator_new__(-(ulong)(uVar20 >> 0x3d != 0) | uVar20 * 8);
      pvVar14 = *(void **)((long)&pAVar6->_data + lVar23);
      if (pvVar14 != (void *)0x0) {
        operator_delete__(pvVar14);
      }
      *(long *)((long)&pAVar6->_sizeX + lVar23) = (long)(int)uVar28;
      *(long *)((long)&pAVar6->_sizeY + lVar23) = (long)(int)uVar30;
      *(void **)((long)&pAVar6->_data + lVar23) = pvVar13;
      lVar23 = lVar23 + 0x18;
    } while (size * 0x18 != lVar23);
  }
  local_2f8 = (long)(int)uVar30;
  pvVar14 = operator_new__(-(ulong)(uVar20 >> 0x3e != 0) | uVar20 << 2);
  if ((anonymous_namespace)::sampleCount._16_8_ != 0) {
    operator_delete__((void *)(anonymous_namespace)::sampleCount._16_8_);
  }
  (anonymous_namespace)::sampleCount._8_8_ = local_2f8;
  (anonymous_namespace)::sampleCount._0_8_ = (long)(int)uVar28;
  (anonymous_namespace)::sampleCount._16_8_ = pvVar14;
  remove((filename->_M_dataplus)._M_p);
  Imf_3_2::DeepScanLineOutputFile::DeepScanLineOutputFile
            (&file,(filename->_M_dataplus)._M_p,(Header *)(anonymous_namespace)::header,8);
  frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header;
  frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  Imf_3_2::Slice::Slice(&frameBuffer._sampleCounts,HALF,(char *)0x0,0,0,1,1,0.0,false,false);
  Imf_3_2::Slice::Slice
            ((Slice *)&ss,UINT,
             (char *)((anonymous_namespace)::sampleCount._16_8_ + (long)(dataWindow->min).x * -4 +
                     (long)(dataWindow->min).y * (long)(int)uVar30 * -4),4,local_2f8 << 2,1,1,0.0,
             false,false);
  Imf_3_2::DeepFrameBuffer::insertSampleCountSlice((Slice *)&frameBuffer);
  if (0 < channelCount) {
    lVar23 = 0x10;
    uVar20 = 0;
    do {
      PVar3 = (anonymous_namespace)::channelTypes[uVar20];
      PVar22 = (uint)(PVar3 != UINT) * 3;
      if (PVar3 == HALF) {
        PVar22 = PVar3;
      }
      if (PVar3 == FLOAT) {
        PVar22 = PVar3;
      }
      std::__cxx11::stringstream::stringstream((stringstream *)&ss);
      std::ostream::operator<<(local_1e0,(int)uVar20);
      std::__cxx11::stringbuf::str();
      iVar8 = (anonymous_namespace)::channelTypes[uVar20];
      uVar26 = (ulong)(iVar8 == 0) << 2;
      if (iVar8 == 1) {
        uVar26 = 2;
      }
      if (iVar8 == 2) {
        uVar26 = 4;
      }
      Imf_3_2::DeepSlice::DeepSlice
                ((DeepSlice *)local_68,PVar22,
                 (char *)(*(long *)((long)&(data._data)->_sizeX + lVar23) +
                          (long)(dataWindow->min).x * -8 +
                         (long)(dataWindow->min).y * (long)(int)uVar30 * -8),8,
                 (long)(int)(uVar30 * 8),uVar26,1,1,0.0,false,false);
      Imf_3_2::DeepFrameBuffer::insert((string *)&frameBuffer,(DeepSlice *)&type);
      if ((long *)CONCAT44(uStack_284,type) != local_278) {
        operator_delete((long *)CONCAT44(uStack_284,type),local_278[0] + 1);
      }
      std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
      std::ios_base::~ios_base(local_170);
      uVar20 = uVar20 + 1;
      lVar23 = lVar23 + 0x18;
    } while (size != uVar20);
  }
  Imf_3_2::DeepScanLineOutputFile::setFrameBuffer((DeepFrameBuffer *)&file);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"writing ",8);
  std::ostream::flush();
  bVar2 = 999 < iVar7 || 999 < iVar17;
  if (bulkWrite) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"bulk ",5);
    std::ostream::flush();
    if (-1 < iVar17) {
      uVar20 = 0;
      do {
        if (-1 < iVar7) {
          iVar27 = (int)uVar20;
          iVar8 = (int)((uVar20 & 0xffffffff) * 0x4104105 >> 0x20);
          uVar26 = 0;
          do {
            iVar9 = random_int(10);
            iVar18 = (int)uVar26;
            if ((bVar2) &&
               (iVar10 = (int)((uVar26 & 0xffffffff) * 0x4104105 >> 0x20),
               (((uint)(iVar18 - iVar10) >> 1) + iVar10 >> 5) * -0x3f + iVar18 != 0 ||
               (((uint)(iVar27 - iVar8) >> 1) + iVar8 >> 5) * -0x3f + iVar27 != 0)) {
              iVar9 = 0;
            }
            lVar23 = (anonymous_namespace)::sampleCount._8_8_ * uVar20;
            *(int *)(lVar23 * 4 + (anonymous_namespace)::sampleCount._16_8_ + uVar26 * 4) = iVar9;
            if (0 < channelCount) {
              uVar21 = (iVar27 * uVar30 + iVar18) % 0x801;
              fVar32 = (float)uVar21;
              uVar19 = (uint)fVar32 & 0x7fffff | 0x800000;
              cVar4 = (char)((uint)fVar32 >> 0x17);
              uVar28 = (uint)fVar32 >> 0xd & 0x3ff;
              uVar16 = (ushort)uVar28 | 0x7c00 | (ushort)(uVar28 == 0);
              uVar5 = (ushort)((int)fVar32 + 0x8000fff + (uint)(((uint)fVar32 >> 0xd & 1) != 0) >>
                              0xd);
              if (0x477fefff < (uint)fVar32) {
                uVar5 = 0x7c00;
              }
              if (fVar32 == INFINITY) {
                uVar16 = 0x7c00;
              }
              if ((uint)fVar32 < 0x7f800000) {
                uVar16 = uVar5;
              }
              uVar5 = (ushort)(0x80000000 < uVar19 << (cVar4 + 0xa2U & 0x1f)) +
                      (short)(uVar19 >> (0x7eU - cVar4 & 0x1f));
              if ((uint)fVar32 < 0x33000001) {
                uVar5 = 0;
              }
              if (0x387fffff < (uint)fVar32) {
                uVar5 = uVar16;
              }
              uVar24 = 0;
              do {
                if (iVar9 < 1) {
                  data._data[uVar24]._data[data._data[uVar24]._sizeY * uVar20 + uVar26] =
                       (void *)0x0;
                }
                else {
                  iVar18 = (anonymous_namespace)::channelTypes[uVar24];
                  if (iVar18 == 0) {
                    pvVar14 = operator_new__((ulong)*(uint *)((anonymous_namespace)::sampleCount.
                                                              _16_8_ + lVar23 * 4 + uVar26 * 4) << 2
                                            );
                    data._data[uVar24]._data[data._data[uVar24]._sizeY * uVar20 + uVar26] = pvVar14;
                    iVar18 = (anonymous_namespace)::channelTypes[uVar24];
                  }
                  if (iVar18 == 1) {
                    pvVar14 = operator_new__((ulong)*(uint *)((anonymous_namespace)::sampleCount.
                                                              _16_8_ + lVar23 * 4 + uVar26 * 4) * 2)
                    ;
                    data._data[uVar24]._data[data._data[uVar24]._sizeY * uVar20 + uVar26] = pvVar14;
                    iVar18 = (anonymous_namespace)::channelTypes[uVar24];
                  }
                  if (iVar18 == 2) {
                    pvVar14 = operator_new__((ulong)*(uint *)((anonymous_namespace)::sampleCount.
                                                              _16_8_ + lVar23 * 4 + uVar26 * 4) << 2
                                            );
                    data._data[uVar24]._data[data._data[uVar24]._sizeY * uVar20 + uVar26] = pvVar14;
                  }
                  piVar15 = (anonymous_namespace)::channelTypes;
                  lVar1 = (anonymous_namespace)::sampleCount._16_8_ + lVar23 * 4;
                  if (*(int *)(lVar1 + uVar26 * 4) != 0) {
                    iVar18 = (anonymous_namespace)::channelTypes[uVar24];
                    uVar25 = 0;
                    do {
                      if (iVar18 == 0) {
                        *(uint *)((long)data._data[uVar24]._data
                                        [data._data[uVar24]._sizeY * uVar20 + uVar26] + uVar25 * 4)
                             = uVar21;
                        iVar18 = piVar15[uVar24];
                      }
                      if (iVar18 == 2) {
                        *(float *)((long)data._data[uVar24]._data
                                         [data._data[uVar24]._sizeY * uVar20 + uVar26] + uVar25 * 4)
                             = fVar32;
                      }
                      else if (iVar18 == 1) {
                        *(ushort *)
                         ((long)data._data[uVar24]._data
                                [data._data[uVar24]._sizeY * uVar20 + uVar26] + uVar25 * 2) = uVar5;
                      }
                      uVar25 = uVar25 + 1;
                    } while (uVar25 < *(uint *)(lVar1 + uVar26 * 4));
                  }
                }
                uVar24 = uVar24 + 1;
              } while (uVar24 != size);
            }
            uVar26 = uVar26 + 1;
          } while (uVar26 != uVar31);
        }
        uVar20 = uVar20 + 1;
      } while (uVar20 != uVar29);
    }
    Imf_3_2::DeepScanLineOutputFile::writePixels((int)&file);
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"per-line ",9);
    std::ostream::flush();
    if (iVar17 < 0) goto LAB_0015158d;
    uVar20 = 0;
    do {
      if (-1 < iVar7) {
        iVar27 = (int)uVar20;
        iVar8 = (int)((uVar20 & 0xffffffff) * 0x4104105 >> 0x20);
        uVar26 = 0;
        do {
          iVar9 = random_int(10);
          iVar18 = (int)uVar26;
          if ((bVar2) &&
             (iVar10 = (int)((uVar26 & 0xffffffff) * 0x4104105 >> 0x20),
             (((uint)(iVar18 - iVar10) >> 1) + iVar10 >> 5) * -0x3f + iVar18 != 0 ||
             (((uint)(iVar27 - iVar8) >> 1) + iVar8 >> 5) * -0x3f + iVar27 != 0)) {
            iVar9 = 0;
          }
          lVar23 = (anonymous_namespace)::sampleCount._8_8_ * uVar20;
          *(int *)(lVar23 * 4 + (anonymous_namespace)::sampleCount._16_8_ + uVar26 * 4) = iVar9;
          if (0 < channelCount) {
            uVar21 = (iVar18 + iVar27 * uVar30) % 0x801;
            fVar32 = (float)uVar21;
            uVar19 = (uint)fVar32 & 0x7fffff | 0x800000;
            cVar4 = (char)((uint)fVar32 >> 0x17);
            uVar28 = (uint)fVar32 >> 0xd & 0x3ff;
            uVar16 = (ushort)uVar28 | 0x7c00 | (ushort)(uVar28 == 0);
            uVar5 = (ushort)((int)fVar32 + 0x8000fff + (uint)(((uint)fVar32 >> 0xd & 1) != 0) >> 0xd
                            );
            if (0x477fefff < (uint)fVar32) {
              uVar5 = 0x7c00;
            }
            if (fVar32 == INFINITY) {
              uVar16 = 0x7c00;
            }
            if ((uint)fVar32 < 0x7f800000) {
              uVar16 = uVar5;
            }
            uVar5 = (ushort)(0x80000000 < uVar19 << (cVar4 + 0xa2U & 0x1f)) +
                    (short)(uVar19 >> (0x7eU - cVar4 & 0x1f));
            if ((uint)fVar32 < 0x33000001) {
              uVar5 = 0;
            }
            if (0x387fffff < (uint)fVar32) {
              uVar5 = uVar16;
            }
            uVar24 = 0;
            do {
              if (iVar9 < 1) {
                data._data[uVar24]._data[data._data[uVar24]._sizeY * uVar20 + uVar26] = (void *)0x0;
              }
              else {
                iVar18 = (anonymous_namespace)::channelTypes[uVar24];
                if (iVar18 == 0) {
                  pvVar14 = operator_new__((ulong)*(uint *)((anonymous_namespace)::sampleCount.
                                                            _16_8_ + lVar23 * 4 + uVar26 * 4) << 2);
                  data._data[uVar24]._data[data._data[uVar24]._sizeY * uVar20 + uVar26] = pvVar14;
                  iVar18 = (anonymous_namespace)::channelTypes[uVar24];
                }
                if (iVar18 == 1) {
                  pvVar14 = operator_new__((ulong)*(uint *)((anonymous_namespace)::sampleCount.
                                                            _16_8_ + lVar23 * 4 + uVar26 * 4) * 2);
                  data._data[uVar24]._data[data._data[uVar24]._sizeY * uVar20 + uVar26] = pvVar14;
                  iVar18 = (anonymous_namespace)::channelTypes[uVar24];
                }
                if (iVar18 == 2) {
                  pvVar14 = operator_new__((ulong)*(uint *)((anonymous_namespace)::sampleCount.
                                                            _16_8_ + lVar23 * 4 + uVar26 * 4) << 2);
                  data._data[uVar24]._data[data._data[uVar24]._sizeY * uVar20 + uVar26] = pvVar14;
                }
                piVar15 = (anonymous_namespace)::channelTypes;
                lVar1 = (anonymous_namespace)::sampleCount._16_8_ + lVar23 * 4;
                if (*(int *)(lVar1 + uVar26 * 4) != 0) {
                  iVar18 = (anonymous_namespace)::channelTypes[uVar24];
                  uVar25 = 0;
                  do {
                    if (iVar18 == 0) {
                      *(uint *)((long)data._data[uVar24]._data
                                      [data._data[uVar24]._sizeY * uVar20 + uVar26] + uVar25 * 4) =
                           uVar21;
                      iVar18 = piVar15[uVar24];
                    }
                    if (iVar18 == 2) {
                      *(float *)((long)data._data[uVar24]._data
                                       [data._data[uVar24]._sizeY * uVar20 + uVar26] + uVar25 * 4) =
                           fVar32;
                    }
                    else if (iVar18 == 1) {
                      *(ushort *)
                       ((long)data._data[uVar24]._data[data._data[uVar24]._sizeY * uVar20 + uVar26]
                       + uVar25 * 2) = uVar5;
                    }
                    uVar25 = uVar25 + 1;
                  } while (uVar25 < *(uint *)(lVar1 + uVar26 * 4));
                }
              }
              uVar24 = uVar24 + 1;
            } while (uVar24 != size);
          }
          uVar26 = uVar26 + 1;
        } while (uVar26 != uVar31);
      }
      Imf_3_2::DeepScanLineOutputFile::writePixels((int)&file);
      uVar20 = uVar20 + 1;
    } while (uVar20 != uVar29);
  }
  if (-1 < iVar17) {
    uVar20 = 0;
    do {
      if (-1 < iVar7) {
        uVar26 = 0;
        do {
          if (0 < channelCount) {
            lVar23 = 4;
            uVar24 = 0;
            piVar15 = (anonymous_namespace)::channelTypes;
            do {
              iVar8 = piVar15[uVar24];
              if (iVar8 == 0) {
                pvVar14 = *(void **)(*(long *)((long)data._data + lVar23 * 4 + -8) * uVar20 * 8 +
                                     *(long *)((long)&(data._data)->_sizeX + lVar23 * 4) +
                                    uVar26 * 8);
                if (pvVar14 != (void *)0x0) {
                  operator_delete__(pvVar14);
                  iVar8 = (anonymous_namespace)::channelTypes[uVar24];
                  piVar15 = (anonymous_namespace)::channelTypes;
                  goto LAB_001514ff;
                }
              }
              else {
LAB_001514ff:
                if (iVar8 == 1) {
                  pvVar14 = *(void **)(*(long *)((long)data._data + lVar23 * 4 + -8) * uVar20 * 8 +
                                       *(long *)((long)&(data._data)->_sizeX + lVar23 * 4) +
                                      uVar26 * 8);
                  if (pvVar14 == (void *)0x0) goto LAB_00151563;
                  operator_delete__(pvVar14);
                  iVar8 = (anonymous_namespace)::channelTypes[uVar24];
                  piVar15 = (anonymous_namespace)::channelTypes;
                }
                if ((iVar8 == 2) &&
                   (pvVar14 = *(void **)(*(long *)((long)data._data + lVar23 * 4 + -8) * uVar20 * 8
                                         + *(long *)((long)&(data._data)->_sizeX + lVar23 * 4) +
                                        uVar26 * 8), pvVar14 != (void *)0x0)) {
                  operator_delete__(pvVar14);
                  piVar15 = (anonymous_namespace)::channelTypes;
                }
              }
LAB_00151563:
              uVar24 = uVar24 + 1;
              lVar23 = lVar23 + 6;
            } while (size != uVar24);
          }
          uVar26 = uVar26 + 1;
        } while (uVar26 != uVar31);
      }
      uVar20 = uVar20 + 1;
    } while (uVar20 != uVar29);
  }
LAB_0015158d:
  std::
  _Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::DeepSlice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::DeepSlice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::DeepSlice>_>_>
  ::~_Rb_tree((_Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::DeepSlice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::DeepSlice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::DeepSlice>_>_>
               *)&frameBuffer);
  Imf_3_2::DeepScanLineOutputFile::~DeepScanLineOutputFile(&file);
  Imf_3_2::Array<Imf_3_2::Array2D<void_*>_>::~Array(&data);
  return;
}

Assistant:

void
generateRandomFile (
    const std::string filename,
    int               channelCount,
    Compression       compression,
    bool              bulkWrite,
    const Box2i&      dataWindow,
    const Box2i&      displayWindow)
{
    cout << "generating " << flush;
    header = Header (
        displayWindow,
        dataWindow,
        1,
        IMATH_NAMESPACE::V2f (0, 0),
        1,
        INCREASING_Y,
        compression);

    cout << "compression " << compression << " " << flush;

    int width  = dataWindow.max.x - dataWindow.min.x + 1;
    int height = dataWindow.max.y - dataWindow.min.y + 1;

    //
    // Add channels.
    //

    channelTypes.clear ();

    for (int i = 0; i < channelCount; i++)
    {
        int          type = random_int (3);
        stringstream ss;
        ss << i;
        string str = ss.str ();
        if (type == 0) header.channels ().insert (str, Channel (IMF::UINT));
        if (type == 1) header.channels ().insert (str, Channel (IMF::HALF));
        if (type == 2) header.channels ().insert (str, Channel (IMF::FLOAT));
        channelTypes.push_back (type);
    }

    header.setType (DEEPSCANLINE);

    Array<Array2D<void*>> data (channelCount);
    for (int i = 0; i < channelCount; i++)
        data[i].resizeErase (height, width);

    sampleCount.resizeErase (height, width);

    remove (filename.c_str ());
    DeepScanLineOutputFile file (filename.c_str (), header, 8);

    DeepFrameBuffer frameBuffer;

    frameBuffer.insertSampleCountSlice (Slice (
        IMF::UINT, // type // 7
        (char*) (&sampleCount[0][0] - dataWindow.min.x - dataWindow.min.y * width), // base
        sizeof (unsigned int) * 1,       // xStride
        sizeof (unsigned int) * width)); // yStride

    for (int i = 0; i < channelCount; i++)
    {
        PixelType type = NUM_PIXELTYPES;
        if (channelTypes[i] == 0) type = IMF::UINT;
        if (channelTypes[i] == 1) type = IMF::HALF;
        if (channelTypes[i] == 2) type = IMF::FLOAT;

        stringstream ss;
        ss << i;
        string str = ss.str ();

        int sampleSize = 0;
        if (channelTypes[i] == 0) sampleSize = sizeof (unsigned int);
        if (channelTypes[i] == 1) sampleSize = sizeof (half);
        if (channelTypes[i] == 2) sampleSize = sizeof (float);

        int pointerSize = sizeof (char*);

        frameBuffer.insert (
            str, // name // 6
            DeepSlice (
                type, // type // 7
                (char*) (&data[i][0][0] - dataWindow.min.x - dataWindow.min.y * width), // base // 8
                pointerSize * 1,     // xStride// 9
                pointerSize * width, // yStride// 10
                sampleSize));        // sampleStride
    }

    file.setFrameBuffer (frameBuffer);

    int maxSamples = 10;

    bool bigFile = width > 1000 || height > 1000;

    cout << "writing " << flush;
    if (bulkWrite)
    {
        cout << "bulk " << flush;
        for (int i = 0; i < height; i++)
        {
            //
            // Fill in data at the last minute.
            //

            for (int j = 0; j < width; j++)
            {
                int samples = random_int (maxSamples);

                // big files write very sparse data for efficiency: most pixels have no samples

                if (bigFile && (i % 63 != 0 || j % 63 != 0)) { samples = 0; }
                sampleCount[i][j] = samples;

                for (int k = 0; k < channelCount; k++)
                {
                    if (samples > 0)
                    {

                        if (channelTypes[k] == 0)
                            data[k][i][j] = new unsigned int[sampleCount[i][j]];
                        if (channelTypes[k] == 1)
                            data[k][i][j] = new half[sampleCount[i][j]];
                        if (channelTypes[k] == 2)
                            data[k][i][j] = new float[sampleCount[i][j]];
                        for (unsigned int l = 0; l < sampleCount[i][j]; l++)
                        {
                            if (channelTypes[k] == 0)
                                ((unsigned int*) data[k][i][j])[l] =
                                    (i * width + j) % 2049;
                            if (channelTypes[k] == 1)
                                ((half*) data[k][i][j])[l] =
                                    (i * width + j) % 2049;
                            if (channelTypes[k] == 2)
                                ((float*) data[k][i][j])[l] =
                                    (i * width + j) % 2049;
                        }
                    }
                    else
                    {
                        data[k][i][j] = nullptr;
                    }
                }
            }
        }

        file.writePixels (height);
    }
    else
    {
        cout << "per-line " << flush;
        for (int i = 0; i < height; i++)
        {
            //
            // Fill in data at the last minute.
            //

            for (int j = 0; j < width; j++)
            {
                int samples = random_int (maxSamples);

                // big files write very sparse data for efficiency: most pixels have no samples
                if (bigFile && (i % 63 != 0 || j % 63 != 0)) { samples = 0; }
                sampleCount[i][j] = samples;

                for (int k = 0; k < channelCount; k++)
                {

                    if (samples > 0)
                    {
                        if (channelTypes[k] == 0)
                            data[k][i][j] = new unsigned int[sampleCount[i][j]];
                        if (channelTypes[k] == 1)
                            data[k][i][j] = new half[sampleCount[i][j]];
                        if (channelTypes[k] == 2)
                            data[k][i][j] = new float[sampleCount[i][j]];
                        for (unsigned int l = 0; l < sampleCount[i][j]; l++)
                        {
                            if (channelTypes[k] == 0)
                                ((unsigned int*) data[k][i][j])[l] =
                                    (i * width + j) % 2049;
                            if (channelTypes[k] == 1)
                                ((half*) data[k][i][j])[l] =
                                    (i * width + j) % 2049;
                            if (channelTypes[k] == 2)
                                ((float*) data[k][i][j])[l] =
                                    (i * width + j) % 2049;
                        }
                    }
                    else
                    {
                        data[k][i][j] = nullptr;
                    }
                }
            }
            file.writePixels (1);
        }
    }

    for (int i = 0; i < height; i++)
        for (int j = 0; j < width; j++)
            for (int k = 0; k < channelCount; k++)
            {
                if (channelTypes[k] == 0) delete[](unsigned int*) data[k][i][j];
                if (channelTypes[k] == 1) delete[](half*) data[k][i][j];
                if (channelTypes[k] == 2) delete[](float*) data[k][i][j];
            }
}